

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall
Generator_hodgkinHuxleySquidAxonModel1952WithVariousExternalVariables_Test::TestBody
          (Generator_hodgkinHuxleySquidAxonModel1952WithVariousExternalVariables_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  shared_ptr *psVar3;
  string sVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar5;
  char *pcVar6;
  AssertionResult gtest_ar;
  AnalyserModelPtr analyserModel;
  AssertionResult gtest_ar_2;
  GeneratorPtr generator;
  AnalyserPtr analyser;
  ModelPtr model;
  AnalyserExternalVariablePtr external_sodium_channel_i_Na;
  VariablePtr potassium_channel_n_gate_alpha_n;
  ParserPtr parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  long *local_f8 [2];
  long local_e8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  internal local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  shared_ptr *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  shared_ptr *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  string local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  string *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  shared_ptr *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Parser::create(SUB81(local_30,0));
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml","");
  fileContents((string *)&local_118);
  libcellml::Parser::parseModel(local_78);
  paVar1 = &local_118.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  local_f8[0] = (long *)0x0;
  local_d8._M_dataplus._M_p = (pointer)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_118,"size_t(0)","parser->issueCount()",(unsigned_long *)local_f8,
             (unsigned_long *)&local_d8);
  if ((char)local_118._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)(undefined1 *)local_118._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x619,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (local_f8[0] != (long *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') && (local_f8[0] != (long *)0x0)) {
        (**(code **)(*local_f8[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_118._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Analyser::create();
  sVar4 = local_78[0];
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"potassium_channel_n_gate","");
  libcellml::ComponentEntity::component((string *)&local_d8,(bool)sVar4);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"alpha_n","");
  libcellml::Component::variable(local_40);
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_78[0];
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"sodium_channel","");
  libcellml::ComponentEntity::component(local_b8,(bool)sVar4);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"i_Na","");
  libcellml::Component::variable((string *)&local_d8);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_50);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  libcellml::AnalyserExternalVariable::addDependency(local_50);
  sVar4 = local_78[0];
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"sodium_channel_h_gate","");
  libcellml::ComponentEntity::component(local_b8,(bool)sVar4);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"h","");
  libcellml::Component::variable((string *)&local_d8);
  libcellml::AnalyserExternalVariable::addDependency(local_50);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  psVar3 = local_88;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"membrane","");
  libcellml::ComponentEntity::component((string *)&local_98,(bool)local_78[0]);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"V","");
  libcellml::Component::variable(local_b8);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_d8);
  libcellml::Analyser::addExternalVariable(psVar3);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  libcellml::Analyser::addExternalVariable(local_88);
  psVar3 = local_88;
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_118);
  libcellml::Analyser::addExternalVariable(psVar3);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
  }
  libcellml::Analyser::analyseModel(local_88);
  local_f8[0] = (long *)0x0;
  local_d8._M_dataplus._M_p = (pointer)libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_118,"size_t(0)","analyser->errorCount()",(unsigned_long *)local_f8,
             (unsigned_long *)&local_d8);
  if ((char)local_118._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)(undefined1 *)local_118._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x628,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (local_f8[0] != (long *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') && (local_f8[0] != (long *)0x0)) {
        (**(code **)(*local_f8[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_118._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Analyser::model();
  libcellml::Generator::create();
  libcellml::Generator::setModel(local_98);
  libcellml::Generator::profile();
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"model.external.h","");
  libcellml::GeneratorProfile::setInterfaceFileNameString(local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"generator/hodgkin_huxley_squid_axon_model_1952/model.external.h",""
            );
  fileContents((string *)&local_118);
  libcellml::Generator::interfaceCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_a8,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.external.h\")",
             "generator->interfaceCode()",&local_118,&local_d8);
  paVar2 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x633,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_118._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"generator/hodgkin_huxley_squid_axon_model_1952/model.external.c",""
            );
  fileContents((string *)&local_118);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_a8,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.external.c\")",
             "generator->implementationCode()",&local_118,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x634,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_118._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::create((Profile)&local_118);
  this_00 = p_Stack_60;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length;
  local_68 = (string *)local_118._M_dataplus._M_p;
  local_118._M_dataplus._M_p = (pointer)0x0;
  local_118._M_string_length = 0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
    }
  }
  libcellml::Generator::setProfile(local_98);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"generator/hodgkin_huxley_squid_axon_model_1952/model.external.py",
             "");
  fileContents((string *)&local_118);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_a8,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.external.py\")",
             "generator->implementationCode()",&local_118,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x63a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
    if ((long *)local_118._M_dataplus._M_p != (long *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') && ((long *)local_118._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_118._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Generator, hodgkinHuxleySquidAxonModel1952WithVariousExternalVariables)
{
    // Generate some code for the HH52 model with sodium_channel.i_Na as an
    // external variable which has a dependency on
    // potassium_channel_n_gate.alpha_n, another external variable (which is
    // going to be declared after i_Na, so that it ends up with a higher index,
    // meaning that it would normally be computed after i_Na if there was no
    // such a dependency), and on sodium_channel_h_gate.h, a state variable, so
    // that i_Na ends up being computed both in the computeRates() and
    // computeVariables() methods.

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();
    auto potassium_channel_n_gate_alpha_n = model->component("potassium_channel_n_gate")->variable("alpha_n");
    auto external_sodium_channel_i_Na = libcellml::AnalyserExternalVariable::create(model->component("sodium_channel")->variable("i_Na"));

    external_sodium_channel_i_Na->addDependency(potassium_channel_n_gate_alpha_n);
    external_sodium_channel_i_Na->addDependency(model->component("sodium_channel_h_gate")->variable("h"));

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V")));
    analyser->addExternalVariable(external_sodium_channel_i_Na);
    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(potassium_channel_n_gate_alpha_n));

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();

    generator->setModel(analyserModel);

    auto profile = generator->profile();

    profile->setInterfaceFileNameString("model.external.h");

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.external.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.external.c"), generator->implementationCode());

    profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.external.py"), generator->implementationCode());
}